

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptorProto::FieldDescriptorProto
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  void *pvVar1;
  int32 iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FieldOptions *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FieldDescriptorProto_0042aaf0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar5 = (from->_has_bits_).has_bits_[0];
  if ((uVar5 & 1) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->name_).ptr_);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  (this->extendee_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar5 & 2) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->extendee_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->extendee_).ptr_);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  (this->type_name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar5 & 4) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->type_name_).ptr_);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  (this->default_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar5 & 8) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->default_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->default_value_).ptr_);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  (this->json_name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar5 & 0x10) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->json_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->json_name_).ptr_);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar5 & 0x20) == 0) {
    this_00 = (FieldOptions *)0x0;
  }
  else {
    this_00 = (FieldOptions *)operator_new(0x78);
    FieldOptions::FieldOptions(this_00,from->options_);
  }
  this->options_ = this_00;
  iVar2 = from->oneof_index_;
  iVar3 = from->label_;
  iVar4 = from->type_;
  this->number_ = from->number_;
  this->oneof_index_ = iVar2;
  this->label_ = iVar3;
  this->type_ = iVar4;
  return;
}

Assistant:

FieldDescriptorProto::FieldDescriptorProto(const FieldDescriptorProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  extendee_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_extendee()) {
    extendee_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.extendee_);
  }
  type_name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_type_name()) {
    type_name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.type_name_);
  }
  default_value_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_default_value()) {
    default_value_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.default_value_);
  }
  json_name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_json_name()) {
    json_name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.json_name_);
  }
  if (from.has_options()) {
    options_ = new ::google::protobuf::FieldOptions(*from.options_);
  } else {
    options_ = NULL;
  }
  ::memcpy(&number_, &from.number_,
    reinterpret_cast<char*>(&type_) -
    reinterpret_cast<char*>(&number_) + sizeof(type_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FieldDescriptorProto)
}